

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O1

function_conflict
function_create(char *name,size_t args_count,function_impl impl,
               function_impl_interface_singleton singleton)

{
  int iVar1;
  function __ptr;
  size_t sVar2;
  char *__dest;
  signature psVar3;
  function_interface pfVar4;
  
  __ptr = (function)malloc(0x38);
  if (__ptr != (function)0x0) {
    if (name == (char *)0x0) {
      __ptr->name = (char *)0x0;
    }
    else {
      sVar2 = strlen(name);
      __dest = (char *)malloc(sVar2 + 1);
      __ptr->name = __dest;
      if (__dest == (char *)0x0) {
        log_write_impl_va("metacall",0x43,"function_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                          ,3,"Invalid function name allocation <%s>",name);
        free(__ptr);
        return (function_conflict)0x0;
      }
      memcpy(__dest,name,sVar2 + 1);
    }
    __ptr->impl = impl;
    __ptr->async = SYNCHRONOUS;
    __ptr->data = (void *)0x0;
    psVar3 = signature_create(args_count);
    __ptr->s = psVar3;
    if (psVar3 == (signature)0x0) {
      log_write_impl_va("metacall",0x59,"function_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                        ,3,"Invalid function signature allocation");
    }
    else {
      pfVar4 = (function_interface)0x0;
      LOCK();
      (__ptr->ref).count = 0;
      UNLOCK();
      if (singleton != (function_impl_interface_singleton)0x0) {
        pfVar4 = (*singleton)();
      }
      __ptr->interface = pfVar4;
      if (((pfVar4 == (function_interface)0x0) ||
          (pfVar4->create == (function_impl_interface_create)0x0)) ||
         (iVar1 = (*pfVar4->create)(__ptr,impl), iVar1 == 0)) {
        LOCK();
        function_stats.allocations = function_stats.allocations + 1;
        UNLOCK();
        return __ptr;
      }
      log_write_impl_va("metacall",0x66,"function_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                        ,3,"Invalid function (%s) create callback <%p>",__ptr->name,
                        __ptr->interface->create);
    }
    free(__ptr->name);
    free(__ptr);
  }
  return (function_conflict)0x0;
}

Assistant:

function function_create(const char *name, size_t args_count, function_impl impl, function_impl_interface_singleton singleton)
{
	function func = malloc(sizeof(struct function_type));

	if (func == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t func_name_size = strlen(name) + 1;

		func->name = malloc(sizeof(char) * func_name_size);

		if (func->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid function name allocation <%s>", name);

			free(func);

			return NULL;
		}

		memcpy(func->name, name, func_name_size);
	}
	else
	{
		func->name = NULL;
	}

	func->impl = impl;
	func->async = SYNCHRONOUS;
	func->data = NULL;

	func->s = signature_create(args_count);

	if (func->s == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function signature allocation");

		goto function_create_error;
	}

	threading_atomic_ref_count_initialize(&func->ref);

	func->interface = singleton ? singleton() : NULL;

	if (func->interface != NULL && func->interface->create != NULL)
	{
		if (func->interface->create(func, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid function (%s) create callback <%p>", func->name, func->interface->create);

			goto function_create_error;
		}
	}

	reflect_memory_tracker_allocation(function_stats);

	return func;

function_create_error:
	free(func->name);
	free(func);

	return NULL;
}